

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.h
# Opt level: O1

int __thiscall uWS::Loop::init(Loop *this,EVP_PKEY_CTX *ctx)

{
  undefined8 *puVar1;
  void *pvVar2;
  
  puVar1 = (undefined8 *)us_loop_ext();
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *(undefined8 *)((long)puVar1 + 0x1c) = 0;
  *(undefined8 *)((long)puVar1 + 0x24) = 0;
  *(undefined4 *)(puVar1 + 0xd) = 0;
  puVar1[0xe] = 0;
  puVar1[0xf] = puVar1 + 0xd;
  puVar1[0x10] = puVar1 + 0xd;
  puVar1[0x11] = 0;
  *(undefined4 *)(puVar1 + 0x13) = 0;
  puVar1[0x14] = 0;
  puVar1[0x15] = puVar1 + 0x13;
  puVar1[0x16] = puVar1 + 0x13;
  puVar1[0x17] = 0;
  pvVar2 = operator_new__(0x4000);
  puVar1[0x18] = pvVar2;
  *(undefined4 *)(puVar1 + 0x19) = 0;
  puVar1[0x1a] = 0;
  puVar1[0x1b] = 0;
  puVar1[0x1c] = 0;
  puVar1[0x1d] = 0;
  return (int)this;
}

Assistant:

Loop *init() {
        new (us_loop_ext((us_loop_t *) this)) LoopData;
        return this;
    }